

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

void wasm::destroyAllTypesForTestingPurposesOnly(void)

{
  unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>
  *puVar1;
  allocator<std::unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,_std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>_>_>
  *extraout_RDX;
  
  std::
  _Hashtable<std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_std::pair<const_std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>,_std::hash<std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear((_Hashtable<std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_std::pair<const_std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>,_std::hash<std::reference_wrapper<const_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)((anonymous_namespace)::globalTupleStore + 0x40));
  std::
  vector<std::unique_ptr<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_std::default_delete<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>,_std::allocator<std::unique_ptr<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_std::default_delete<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>_>_>
  ::clear((vector<std::unique_ptr<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_std::default_delete<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>,_std::allocator<std::unique_ptr<std::vector<wasm::Type,_std::allocator<wasm::Type>_>,_std::default_delete<std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>_>_>
           *)((anonymous_namespace)::globalTupleStore + 0x28));
  puVar1 = (anonymous_namespace)::globalHeapTypeStore;
  if (DAT_011764d0 != (anonymous_namespace)::globalHeapTypeStore) {
    std::
    _Destroy<std::unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>>*,std::unique_ptr<wasm::(anonymous_namespace)::HeapTypeInfo,std::default_delete<wasm::(anonymous_namespace)::HeapTypeInfo>>>
              ((anonymous_namespace)::globalHeapTypeStore,DAT_011764d0,extraout_RDX);
    DAT_011764d0 = puVar1;
  }
  std::
  _Hashtable<wasm::(anonymous_namespace)::RecGroupStructure,_wasm::(anonymous_namespace)::RecGroupStructure,_std::allocator<wasm::(anonymous_namespace)::RecGroupStructure>,_std::__detail::_Identity,_std::equal_to<wasm::(anonymous_namespace)::RecGroupStructure>,_std::hash<wasm::(anonymous_namespace)::RecGroupStructure>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::clear((_Hashtable<wasm::(anonymous_namespace)::RecGroupStructure,_wasm::(anonymous_namespace)::RecGroupStructure,_std::allocator<wasm::(anonymous_namespace)::RecGroupStructure>,_std::__detail::_Identity,_std::equal_to<wasm::(anonymous_namespace)::RecGroupStructure>,_std::hash<wasm::(anonymous_namespace)::RecGroupStructure>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           *)((anonymous_namespace)::globalRecGroupStore + 0x28));
  std::
  vector<std::unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::allocator<std::unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>_>
  ::clear((vector<std::unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::allocator<std::unique_ptr<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>_>_>
           *)((anonymous_namespace)::globalRecGroupStore + 0x60));
  return;
}

Assistant:

void destroyAllTypesForTestingPurposesOnly() {
  globalTupleStore.clear();
  globalHeapTypeStore.clear();
  globalRecGroupStore.clear();
}